

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,char (*lhs) [6],string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  char **txt;
  basic_string_view<char,_std::char_traits<char>_> *v;
  ostringstream os;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  lest *local_1b0;
  pointer local_1a8;
  size_type local_1a0;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1b0 = this;
  to_string_abi_cxx11_(&local_1f0,(lest *)&local_1b0,txt);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)lhs,*(long *)(lhs[1] + 2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  local_1a8 = (op->_M_dataplus)._M_p;
  local_1a0 = op->_M_string_length;
  nonstd::sv_lite::to_string<char,std::char_traits<char>>(&local_1d0,(sv_lite *)&local_1a8,v);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}